

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCore.c
# Opt level: O0

int If_ManPerformMapping(If_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  If_Man_t *p_local;
  
  p->pPars->fAreaOnly = p->pPars->fArea;
  If_ManSetupCiCutSets(p);
  iVar1 = If_ManCrossCut(p);
  If_ManSetupSetAll(p,iVar1);
  pVVar2 = If_ManReverseOrder(p);
  p->vObjsRev = pVVar2;
  iVar1 = If_ManPerformMappingComb(p);
  return iVar1;
}

Assistant:

int If_ManPerformMapping( If_Man_t * p )
{
    p->pPars->fAreaOnly = p->pPars->fArea; // temporary
    // create the CI cutsets
    If_ManSetupCiCutSets( p );
    // allocate memory for other cutsets
    If_ManSetupSetAll( p, If_ManCrossCut(p) );
    // derive reverse top order
    p->vObjsRev = If_ManReverseOrder( p );
    return If_ManPerformMappingComb( p );
}